

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_108f1::FormatterTest_TestFormattersEnabled_Test::TestBody
          (FormatterTest_TestFormattersEnabled_Test *this)

{
  return;
}

Assistant:

TEST(FormatterTest, TestFormattersEnabled) {
  check_enabled_formatters<char,
      bool, char, signed char, unsigned char, short, unsigned short,
      int, unsigned, long, unsigned long, long long, unsigned long long,
      float, double, long double, void*, const void*,
      char*, const char*, std::string>();
  check_enabled_formatters<wchar_t,
      bool, wchar_t, signed char, unsigned char, short, unsigned short,
      int, unsigned, long, unsigned long, long long, unsigned long long,
      float, double, long double, void*, const void*,
      wchar_t*, const wchar_t*, std::wstring>();
#if FMT_USE_NULLPTR
  check_enabled_formatters<char, std::nullptr_t>();
  check_enabled_formatters<wchar_t, std::nullptr_t>();
#endif
}